

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SievingPrimes.cpp
# Opt level: O3

int __thiscall primesieve::SievingPrimes::init(SievingPrimes *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  int extraout_EAX;
  long *in_RDX;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  uVar1 = *(ulong *)(ctx + 8);
  auVar6._8_4_ = (int)(uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._12_4_ = 0x45300000;
  dVar5 = SQRT((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  uVar2 = (ulong)dVar5;
  uVar2 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  if (0xfffffffe < uVar2) {
    uVar2 = 0xffffffff;
  }
  uVar3 = uVar2 * 2;
  do {
    uVar4 = uVar2 * uVar2;
    uVar2 = uVar2 - 1;
    uVar3 = uVar3 - 2;
  } while (uVar1 <= uVar4 && uVar4 - uVar1 != 0);
  do {
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 + 2;
  } while (uVar3 < uVar1 - uVar2 * uVar2);
  Erat::init(&this->super_Erat,(EVP_PKEY_CTX *)(*in_RDX + 1));
  tinySieve(this);
  return extraout_EAX;
}

Assistant:

void SievingPrimes::init(Erat* erat, PreSieve& preSieve)
{
  Erat::init(preSieve.getMaxPrime() + 1,
             isqrt(erat->getStop()),
             erat->getSieveSize(),
             preSieve);

  tinySieve();
}